

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QSize __thiscall QDockAreaLayoutItem::maximumSize(QDockAreaLayoutItem *this)

{
  int iVar1;
  int iVar2;
  int extraout_var;
  undefined4 extraout_var_00;
  QSize QVar3;
  ulong uVar4;
  QMargins QVar5;
  
  if (this->widgetItem == (QLayoutItem *)0x0) {
    if (this->subinfo == (QDockAreaLayoutInfo *)0x0) {
      QVar3.wd.m_i = 0xffffff;
      QVar3.ht.m_i = 0;
      uVar4 = 0xffffff;
    }
    else {
      QVar3 = QDockAreaLayoutInfo::maximumSize(this->subinfo);
      uVar4 = (ulong)QVar3 >> 0x20;
    }
  }
  else {
    iVar1 = (*this->widgetItem->_vptr_QLayoutItem[4])();
    iVar2 = (*this->widgetItem->_vptr_QLayoutItem[0xd])();
    QVar5 = QWidget::contentsMargins((QWidget *)CONCAT44(extraout_var_00,iVar2));
    QVar3 = (QSize)(QVar5._0_8_ + CONCAT44(extraout_var,iVar1) + QVar5._8_8_);
    uVar4 = (ulong)(uint)(QVar5.m_bottom.m_i.m_i + QVar5.m_top.m_i.m_i + extraout_var);
  }
  return (QSize)((ulong)QVar3 & 0xffffffff | uVar4 << 0x20);
}

Assistant:

QSize QDockAreaLayoutItem::maximumSize() const
{
    if (widgetItem)
        return widgetItem->maximumSize().grownBy(widgetItem->widget()->contentsMargins());
    if (subinfo != nullptr)
        return subinfo->maximumSize();
    return QSize(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);
}